

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_info.hpp
# Opt level: O3

void __thiscall
mp::FlatModelInfoImpl::AddNumberOfConstraints
          (FlatModelInfoImpl *this,type_info *ti,char *name,int igroup,bool is_logical,int nc)

{
  mapped_type *pmVar1;
  mapped_type *pmVar2;
  mapped_type *pmVar3;
  allocator<char> local_4d;
  int local_4c;
  key_type local_48;
  
  local_4c = igroup;
  pmVar1 = std::__detail::
           _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->cg_map_,&local_4c);
  *pmVar1 = *pmVar1 + nc;
  local_48._M_dataplus._M_p = (pointer)ti;
  pmVar2 = std::__detail::
           _Map_base<std::reference_wrapper<const_std::type_info>,_std::pair<const_std::reference_wrapper<const_std::type_info>,_int>,_std::allocator<std::pair<const_std::reference_wrapper<const_std::type_info>,_int>_>,_std::__detail::_Select1st,_mp::FlatModelInfoImpl::TypeInfoRefEqualTo,_mp::FlatModelInfoImpl::TypeInfoRefHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::reference_wrapper<const_std::type_info>,_std::pair<const_std::reference_wrapper<const_std::type_info>,_int>,_std::allocator<std::pair<const_std::reference_wrapper<const_std::type_info>,_int>_>,_std::__detail::_Select1st,_mp::FlatModelInfoImpl::TypeInfoRefEqualTo,_mp::FlatModelInfoImpl::TypeInfoRefHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->ti_map_,(key_type *)&local_48);
  *pmVar2 = *pmVar2 + nc;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,name,&local_4d);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mp::FlatModelInfo::ConInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mp::FlatModelInfo::ConInfo>_>_>
           ::operator[](&this->coninfo_map_,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  pmVar3->name_ = name;
  pmVar3->is_logical_ = is_logical;
  pmVar3->n_ = nc;
  return;
}

Assistant:

void AddNumberOfConstraints(
      const std::type_info& ti, const char* name,
      int igroup, bool is_logical, int nc) override {
    cg_map_[igroup] += nc;
    ti_map_[ti] += nc;
    auto& ci = coninfo_map_[name];
    ci.name_ = name;
    ci.is_logical_ = is_logical;
    ci.n_ = nc;
  }